

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateTranslationNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time,
          bool inverse)

{
  uint uVar1;
  aiNodeAnim *this_00;
  pointer paVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  aiQuatKey *local_d0;
  aiVectorKey *local_a8;
  aiQuaterniont<float> local_74;
  aiVector3t<float> local_64;
  uint local_58;
  uint i;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> local_48;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  bool inverse_local;
  int64_t start_local;
  LayerMap *layer_map_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *curves_local;
  Model *param_2_local;
  string *name_local;
  FBXConverter *this_local;
  
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl._7_1_ = inverse;
  this_00 = (aiNodeAnim *)operator_new(0x438);
  aiNodeAnim::aiNodeAnim(this_00);
  std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>::
  unique_ptr<std::default_delete<aiNodeAnim>,void>
            ((unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>> *)&local_48,this_00);
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  aiString::Set(&paVar2->mNodeName,name);
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get(&local_48);
  ConvertTranslationKeys(this,paVar2,curves,layer_map,start,stop,max_time,min_time);
  if ((na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    for (local_58 = 0; uVar1 = local_58,
        paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->
                           (&local_48), uVar1 < paVar2->mNumPositionKeys; local_58 = local_58 + 1) {
      paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
      aiVector3t<float>::operator*=(&paVar2->mPositionKeys[local_58].mValue,-1.0);
    }
  }
  paVar3 = (aiVectorKey *)operator_new__(0x18);
  local_a8 = paVar3;
  do {
    aiVectorKey::aiVectorKey(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != paVar3 + 1);
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2->mScalingKeys = paVar3;
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2->mNumScalingKeys = 1;
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2->mScalingKeys->mTime = 0.0;
  aiVector3t<float>::aiVector3t(&local_64,1.0,1.0,1.0);
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar3 = paVar2->mScalingKeys;
  (paVar3->mValue).z = local_64.z;
  (paVar3->mValue).x = local_64.x;
  (paVar3->mValue).y = local_64.y;
  paVar4 = (aiQuatKey *)operator_new__(0x18);
  local_d0 = paVar4;
  do {
    aiQuatKey::aiQuatKey(local_d0);
    local_d0 = local_d0 + 1;
  } while (local_d0 != paVar4 + 1);
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2->mRotationKeys = paVar4;
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2->mNumRotationKeys = 1;
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2->mRotationKeys->mTime = 0.0;
  aiQuaterniont<float>::aiQuaterniont(&local_74);
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar4 = paVar2->mRotationKeys;
  (paVar4->mValue).w = local_74.w;
  (paVar4->mValue).x = local_74.x;
  (paVar4->mValue).y = local_74.y;
  (paVar4->mValue).z = local_74.z;
  paVar2 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::release(&local_48);
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&local_48);
  return paVar2;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateTranslationNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool inverse) {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertTranslationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            if (inverse) {
                for (unsigned int i = 0; i < na->mNumPositionKeys; ++i) {
                    na->mPositionKeys[i].mValue *= -1.0f;
                }
            }

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            return na.release();
        }